

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O2

int ulong_to_str(unsigned_long num,char *str,int strlen)

{
  unsigned_long uVar1;
  long lVar2;
  long lStack_8;
  
  if (num == 0) {
    str[0] = '0';
    str[1] = '\0';
    lStack_8 = 1;
  }
  else {
    lStack_8 = 0;
    for (uVar1 = num; uVar1 != 0; uVar1 = uVar1 / 10) {
      lStack_8 = lStack_8 + 1;
    }
    if ((int)lStack_8 + 1 < strlen) {
      str[lStack_8] = '\0';
      lVar2 = lStack_8;
      while (lVar2 != 0) {
        str[lVar2 + -1] = (byte)(num % 10) | 0x30;
        num = num / 10;
        lVar2 = lVar2 + -1;
      }
    }
    else {
      lStack_8 = -1;
    }
  }
  return (int)lStack_8;
}

Assistant:

static int ulong_to_str(unsigned long num, char *str, int strlen)
{
   int len, i;
   unsigned long val;
   
   if (num == 0) {
      if (strlen < 2)
         return -1;
      str[0] = '0';
      str[1] = '\0';
      return 1;
   }

   for (len = 0, val = num; val; val = val / 10, len++);
   if (len + 1 >= strlen)
      return -1;

   str[len] = '\0';
   val = num;
   for (i = 1; i <= len; i++) {
      str[len - i] = '0' + val % 10;
      val = val / 10;
   }
   return len;
}